

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::AlignmentTests_MultiPoint_Test::TestBody(AlignmentTests_MultiPoint_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  char *in_RCX;
  string_view sv;
  AssertHelper local_120;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_4;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  short local_94 [2];
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_78;
  Message local_70 [3];
  size_type local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  size_t local_30;
  undefined1 local_28 [8];
  Alignment a;
  AlignmentTests_MultiPoint_Test *this_local;
  
  a.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"0-3 7-7");
  sv._M_str = in_RCX;
  sv._M_len = local_30;
  readAlignment((Alignment *)local_28,(thrax *)gtest_ar.message_.ptr_,sv);
  local_4c = 2;
  local_58 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::size
                       ((Alignment *)local_28);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_48,"2","a.size()",&local_4c,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(local_70);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_94[0] = 0;
    local_94[1] = 0;
    pvVar3 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::front
                       ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)local_28);
    testing::internal::EqHelper<true>::Compare<int,short>
              (local_90,"0",(int *)"a.front().src",local_94,pvVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
                 ,0x23,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    local_bc = 3;
    pvVar3 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::front
                       ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)local_28);
    testing::internal::EqHelper<false>::Compare<int,short>
              ((EqHelper<false> *)local_b8,"3","a.front().tgt",&local_bc,&pvVar3->tgt);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
                 ,0x24,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    local_e4 = 7;
    pvVar3 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::back
                       ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)local_28);
    testing::internal::EqHelper<false>::Compare<int,short>
              ((EqHelper<false> *)local_e0,"7","a.back().src",&local_e4,&pvVar3->src);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
                 ,0x25,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    local_10c = 7;
    pvVar3 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::back
                       ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)local_28);
    testing::internal::EqHelper<false>::Compare<int,short>
              ((EqHelper<false> *)local_108,"7","a.back().tgt",&local_10c,&pvVar3->tgt);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(&local_118);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/alignment_test.cpp"
                 ,0x26,pcVar2);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message(&local_118);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    gtest_ar_1.message_.ptr_._4_4_ = 0;
  }
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~vector
            ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)local_28);
  return;
}

Assistant:

TEST(AlignmentTests, MultiPoint) {
  auto a = readAlignment("0-3 7-7");
  ASSERT_EQ(2, a.size());
  EXPECT_EQ(0, a.front().src);
  EXPECT_EQ(3, a.front().tgt);
  EXPECT_EQ(7, a.back().src);
  EXPECT_EQ(7, a.back().tgt);
}